

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

bool __thiscall
prometheus::Registry::Remove<prometheus::Info>(Registry *this,Family<prometheus::Info> *family)

{
  bool bVar1;
  vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
  *this_00;
  const_iterator local_80;
  undefined4 local_74;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>_>
  local_70;
  unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
  *local_68;
  unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
  *local_60;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>_>
  local_58;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>_>
  local_50;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>_>
  it;
  anon_class_8_1_54bc4ca2_for__M_pred same_family;
  vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
  *families;
  lock_guard<std::mutex> lock;
  Family<prometheus::Info> *family_local;
  Registry *this_local;
  
  lock._M_device = (mutex_type *)family;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&families,&this->mutex_);
  this_00 = GetFamilies<prometheus::Info>(this);
  it._M_current =
       (unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
        *)lock._M_device;
  local_58._M_current =
       (unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
        *)std::
          vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
          ::begin(this_00);
  local_60 = (unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
              *)std::
                vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
                ::end(this_00);
  local_68 = it._M_current;
  local_50 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>>,prometheus::Registry::Remove<prometheus::Info>(prometheus::Family<prometheus::Info>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>const&)_1_>
                       (local_58,(__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>_>
                                  )local_60,(anon_class_8_1_54bc4ca2_for__M_pred)it._M_current);
  local_70._M_current =
       (unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>
        *)std::
          vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
          ::end(this_00);
  bVar1 = __gnu_cxx::operator==(&local_50,&local_70);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>const*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>>
    ::
    __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>*>
              ((__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>const*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,std::default_delete<prometheus::Family<prometheus::Info>>>>>>
                *)&local_80,&local_50);
    std::
    vector<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Info>,_std::default_delete<prometheus::Family<prometheus::Info>_>_>_>_>
    ::erase(this_00,local_80);
  }
  this_local._7_1_ = !bVar1;
  local_74 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&families);
  return this_local._7_1_;
}

Assistant:

bool Registry::Remove(const Family<T>& family) {
  std::lock_guard<std::mutex> lock{mutex_};

  auto& families = GetFamilies<T>();
  auto same_family = [&family](const std::unique_ptr<Family<T>>& in) {
    return &family == in.get();
  };

  auto it = std::find_if(families.begin(), families.end(), same_family);
  if (it == families.end()) {
    return false;
  }

  families.erase(it);
  return true;
}